

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::EventContext::EventContext
          (EventContext *this,TracePacketHandle *trace_packet,
          TrackEventIncrementalState *incremental_state,TrackEventTlsState *tls_state)

{
  Message *pMVar1;
  
  (this->trace_packet_).super_MessageHandleBase.message_ =
       (trace_packet->super_MessageHandleBase).message_;
  (trace_packet->super_MessageHandleBase).message_ = (Message *)0x0;
  pMVar1 = protozero::Message::BeginNestedMessageInternal
                     ((this->trace_packet_).super_MessageHandleBase.message_,0xb);
  this->event_ = (TrackEvent *)pMVar1;
  this->incremental_state_ = incremental_state;
  this->tls_state_ = tls_state;
  return;
}

Assistant:

EventContext::EventContext(
    EventContext::TracePacketHandle trace_packet,
    internal::TrackEventIncrementalState* incremental_state,
    const internal::TrackEventTlsState* tls_state)
    : trace_packet_(std::move(trace_packet)),
      event_(trace_packet_->set_track_event()),
      incremental_state_(incremental_state),
      tls_state_(tls_state) {}